

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall
SQCompiler::ResolveContinues
          (SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve,SQInteger targetpos)

{
  SQUnsignedInteger SVar1;
  long pos;
  
  for (; 0 < ntoresolve; ntoresolve = ntoresolve + -1) {
    SVar1 = (funcstate->_unresolvedcontinues)._size;
    pos = (funcstate->_unresolvedcontinues)._vals[SVar1 - 1];
    (funcstate->_unresolvedcontinues)._size = SVar1 - 1;
    SQFuncState::SetIntructionParams(funcstate,pos,0,targetpos - pos,0,0);
  }
  return;
}

Assistant:

void ResolveContinues(SQFuncState *funcstate, SQInteger ntoresolve, SQInteger targetpos)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedcontinues.back();
            funcstate->_unresolvedcontinues.pop_back();
            //set the jmp instruction
            funcstate->SetIntructionParams(pos, 0, targetpos - pos, 0);
            ntoresolve--;
        }
    }